

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O1

int Ssc_GiaSimClassRefineOne(Gia_Man_t *p,int i)

{
  Vec_Int_t **ppVVar1;
  Vec_Int_t **ppVVar2;
  word *pwVar3;
  int iVar4;
  Vec_Int_t *p_00;
  word *pwVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  Vec_Int_t **ppVVar12;
  int iVar13;
  
  ppVVar1 = &p->vClassOld;
  ppVVar2 = &p->vClassNew;
  iVar9 = 0;
  do {
    if (((~(uint)p->pReprs[i] & 0xfffffff) != 0) || (p->pNexts[i] < 1)) {
      __assert_fail("Gia_ObjIsHead( p, i )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                    ,0xc9,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
    }
    p_00 = p->vClassOld;
    p_00->nSize = 0;
    p->vClassNew->nSize = 0;
    Vec_IntPush(p_00,i);
    if ((i < 0) || (p->nObjs <= i)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (((~(uint)p->pReprs[i] & 0xfffffff) != 0) || (p->pNexts[i] < 1)) {
      __assert_fail("Gia_ObjIsHead(p, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                    ,0xce,"int Ssc_GiaSimClassRefineOne(Gia_Man_t *, int)");
    }
    for (iVar13 = p->pNexts[i]; iVar13 != 0; iVar13 = p->pNexts[iVar13]) {
      uVar6 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
      iVar7 = (int)uVar6;
      uVar8 = iVar7 * i;
      if ((int)uVar8 < 0) {
LAB_005b4ac0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      iVar4 = p->vSims->nSize;
      if (((iVar4 <= (int)uVar8) || (uVar10 = iVar7 * iVar13, (int)uVar10 < 0)) ||
         (iVar4 <= (int)uVar10)) goto LAB_005b4ac0;
      pwVar5 = p->vSims->pArray;
      pwVar3 = pwVar5 + uVar8;
      pwVar5 = pwVar5 + uVar10;
      ppVVar12 = ppVVar1;
      if ((((uint)*pwVar5 ^ (uint)*pwVar3) & 1) == 0) {
        if (0 < iVar7) {
          uVar11 = 0;
          do {
            ppVVar12 = ppVVar2;
            if (pwVar3[uVar11] != pwVar5[uVar11]) break;
            uVar11 = uVar11 + 1;
            ppVVar12 = ppVVar1;
          } while ((uVar6 & 0xffffffff) != uVar11);
        }
      }
      else if (0 < iVar7) {
        uVar11 = 0;
        do {
          ppVVar12 = ppVVar2;
          if ((pwVar5[uVar11] ^ pwVar3[uVar11]) != 0xffffffffffffffff) break;
          uVar11 = uVar11 + 1;
          ppVVar12 = ppVVar1;
        } while ((uVar6 & 0xffffffff) != uVar11);
      }
      Vec_IntPush(*ppVVar12,iVar13);
    }
    if ((*ppVVar2)->nSize == 0) {
      iVar13 = 0;
LAB_005b4aad:
      return iVar9 + iVar13;
    }
    Ssc_GiaSimClassCreate(p,p->vClassOld);
    Ssc_GiaSimClassCreate(p,p->vClassNew);
    if (p->vClassNew->nSize < 2) {
      iVar13 = 1;
      goto LAB_005b4aad;
    }
    i = *p->vClassNew->pArray;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

int Ssc_GiaSimClassRefineOne( Gia_Man_t * p, int i )
{
    Gia_Obj_t * pObj;
    int Ent;
    assert( Gia_ObjIsHead( p, i ) );
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj = Gia_ManObj(p, i);
    Gia_ClassForEachObj1( p, i, Ent )
    {
        if ( Ssc_GiaSimAreEqual( p, i, Ent ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Ssc_GiaSimClassCreate( p, p->vClassOld );
    Ssc_GiaSimClassCreate( p, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Ssc_GiaSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}